

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::DeleteFromSEL(Clipper *this,TEdge *e)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  TEdge **ppTVar3;
  
  pTVar1 = e->nextInSEL;
  pTVar2 = e->prevInSEL;
  if (((pTVar2 == (TEdge *)0x0) && (pTVar1 == (TEdge *)0x0)) && (this->m_SortedEdges != e)) {
    return;
  }
  ppTVar3 = &pTVar2->nextInSEL;
  if (pTVar2 == (TEdge *)0x0) {
    ppTVar3 = &this->m_SortedEdges;
  }
  *ppTVar3 = pTVar1;
  if (pTVar1 != (TEdge *)0x0) {
    pTVar1->prevInSEL = pTVar2;
  }
  e->nextInSEL = (TEdge *)0x0;
  e->prevInSEL = (TEdge *)0x0;
  return;
}

Assistant:

void Clipper::DeleteFromSEL(TEdge *e)
{
  TEdge* SelPrev = e->prevInSEL;
  TEdge* SelNext = e->nextInSEL;
  if( !SelPrev &&  !SelNext && (e != m_SortedEdges) ) return; //already deleted
  if( SelPrev ) SelPrev->nextInSEL = SelNext;
  else m_SortedEdges = SelNext;
  if( SelNext ) SelNext->prevInSEL = SelPrev;
  e->nextInSEL = 0;
  e->prevInSEL = 0;
}